

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O2

void __thiscall
libguarded::
rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::
~rcu_list(rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
          *this)

{
  __pointer_type pnVar1;
  __pointer_type pzVar2;
  __pointer_type pnVar3;
  __pointer_type pzVar4;
  
  pnVar3 = (this->m_head)._M_b._M_p;
  while (pnVar3 != (__pointer_type)0x0) {
    pnVar1 = (pnVar3->next)._M_b._M_p;
    operator_delete(pnVar3,0x20);
    pnVar3 = pnVar1;
  }
  pzVar4 = (this->m_zombie_head)._M_b._M_p;
  while ((pzVar4 != (__pointer_type)0x0 && ((pzVar4->owner)._M_b._M_p == (__pointer_type)0x0))) {
    pzVar2 = (pzVar4->next)._M_b._M_p;
    if (pzVar4->zombie_node != (node *)0x0) {
      operator_delete(pzVar4->zombie_node,0x20);
    }
    operator_delete(pzVar4,0x18);
    pzVar4 = pzVar2;
  }
  return;
}

Assistant:

rcu_list<T, M, Alloc>::~rcu_list()
{
   node *n = m_head.load();

   while (n != nullptr) {
      node *current = n;
      n = n->next.load();

      if (current != nullptr) {
         node_alloc_trait::destroy(m_node_alloc, current);
         node_alloc_trait::deallocate(m_node_alloc, current, 1);
      }
   }

   zombie_list_node *zn = m_zombie_head.load();

   while (zn != nullptr && zn->owner.load() == nullptr) {
      zombie_list_node *current = zn;
      zn = zn->next.load();

      if (current->zombie_node != nullptr) {
         node_alloc_trait::destroy(m_node_alloc, current->zombie_node);
         node_alloc_trait::deallocate(m_node_alloc, current->zombie_node, 1);
      }

      if (current != nullptr) {
         zombie_alloc_trait::destroy(m_zombie_alloc, current);
         zombie_alloc_trait::deallocate(m_zombie_alloc, current, 1);
      }
   }
}